

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AmsConnection.h
# Opt level: O2

void __thiscall
AmsRequest::AmsRequest
          (AmsRequest *this,AmsAddr *ams,uint16_t __port,uint16_t __cmdId,uint32_t __bufferLength,
          void *__buffer,uint32_t *__bytesRead,size_t payloadLength)

{
  Frame::Frame(&this->frame,payloadLength + 0x26,(void *)0x0);
  this->destAddr = ams;
  this->port = __port;
  this->cmdId = __cmdId;
  this->bufferLength = __bufferLength;
  this->buffer = __buffer;
  this->bytesRead = __bytesRead;
  (this->deadline).__d.__r = 0;
  return;
}

Assistant:

AmsRequest(const AmsAddr& ams,
               uint16_t       __port,
               uint16_t       __cmdId,
               uint32_t       __bufferLength = 0,
               void*          __buffer = nullptr,
               uint32_t*      __bytesRead = nullptr,
               size_t         payloadLength = 0)
        : frame(sizeof(AmsTcpHeader) + sizeof(AoEHeader) + payloadLength),
        destAddr(ams),
        port(__port),
        cmdId(__cmdId),
        bufferLength(__bufferLength),
        buffer(__buffer),
        bytesRead(__bytesRead)
    {}